

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O2

bool __thiscall ON_wString::Insert(ON_wString *this,int index,wchar_t ch,int insert_count)

{
  size_t array_capacity;
  uint uVar1;
  ON_Internal_Empty_wString *pOVar2;
  ulong uVar3;
  wchar_t *__src;
  ulong uVar4;
  
  if (ch == L'\0' || (insert_count | index) < 0) {
    uVar4 = 0;
  }
  else {
    pOVar2 = (ON_Internal_Empty_wString *)(this->m_s + -3);
    if (this->m_s == (wchar_t *)0x0) {
      pOVar2 = &empty_wstring;
    }
    uVar1 = (pOVar2->header).string_length;
    uVar4 = 0;
    if ((uint)index <= uVar1) {
      array_capacity = (long)(int)uVar1 + (ulong)(uint)insert_count;
      ReserveArray(this,array_capacity);
      __src = this->m_s + (uint)index;
      memmove(__src + (uint)insert_count,__src,((long)(int)uVar1 - (ulong)(uint)index) * 4 + 4);
      uVar3 = (ulong)(uint)insert_count;
      if (insert_count < 1) {
        uVar3 = uVar4;
      }
      for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        __src[uVar4] = ch;
      }
      pOVar2 = (ON_Internal_Empty_wString *)(this->m_s + -3);
      if (this->m_s == (wchar_t *)0x0) {
        pOVar2 = &empty_wstring;
      }
      (pOVar2->header).string_length = (int)array_capacity;
      uVar4 = 1;
    }
  }
  return SUB81(uVar4,0);
}

Assistant:

bool ON_wString::Insert(int index, wchar_t ch, int insert_count)
{
  if ((index < 0) || (insert_count < 0) || (ch == 0))
    return false;

  const auto length = size_t(Header()->string_length);
  if (index > length)
    return false;

  const auto new_length = length + insert_count;
  ReserveArray(new_length);

  auto* p = m_s + index;
  const auto move_bytes = (length - index + 1) * sizeof(wchar_t);
  memmove(p + insert_count, p, move_bytes);

  for (int i = 0; i < insert_count; i++)
  {
    p[i] = ch;
  }

  Header()->string_length = int(new_length);

  return true;
}